

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_fragment.cpp
# Opt level: O1

ON_SubD * __thiscall ON_SubDMesh::SubD(ON_SubD *__return_storage_ptr__,ON_SubDMesh *this)

{
  ON_SubDMeshImpl *subd_limple;
  
  subd_limple = (this->m_impl_sp).super___shared_ptr<ON_SubDMeshImpl,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr;
  if (subd_limple == (ON_SubDMeshImpl *)0x0) {
    ON_SubD::ON_SubD(__return_storage_ptr__,&ON_SubD::Empty);
  }
  else {
    ON_SubD::ON_SubD(__return_storage_ptr__);
    ON_SubD::ShareDimple(__return_storage_ptr__,subd_limple);
  }
  return __return_storage_ptr__;
}

Assistant:

ON_SubD ON_SubDMesh::SubD() const
{
  const ON_SubDMeshImpl* impl = m_impl_sp.get();
  if ( nullptr == impl )
    return ON_SubD::Empty;
  ON_SubD subd;
  subd.ShareDimple(*impl);
  return subd;
}